

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  Error EVar4;
  Error EVar5;
  Error EVar6;
  long lVar7;
  uint uVar8;
  uint32_t advance;
  ulong uVar9;
  uint32_t uVar10;
  char *pcVar11;
  undefined1 *puVar12;
  uint uVar13;
  uint uVar14;
  uint32_t count;
  ulong uVar15;
  ulong uVar16;
  Operand_ *op;
  Error unaff_R15D;
  bool bVar17;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_40;
  
  uVar1 = detail->instId;
  uVar16 = (ulong)uVar1;
  uVar2 = detail->options;
  if (0x59b < uVar16) {
    EVar4 = StringBuilder::appendFormat(sb,"<unknown id=#%u>",uVar16);
    if (EVar4 != 0) {
      return EVar4;
    }
    goto LAB_00165e29;
  }
  if (((((((uVar2 & 0x40) == 0) ||
         (unaff_R15D = StringBuilder::_opString(sb,1,"short ",0xffffffffffffffff),
         EVar4 = unaff_R15D, unaff_R15D == 0)) &&
        ((-1 < (char)uVar2 ||
         (EVar4 = StringBuilder::_opString(sb,1,"long ",0xffffffffffffffff), EVar4 == 0)))) &&
       (((uVar2 >> 0x10 & 1) == 0 ||
        (EVar4 = StringBuilder::_opString(sb,1,"xacquire ",0xffffffffffffffff), EVar4 == 0)))) &&
      (((uVar2 >> 0x11 & 1) == 0 ||
       (EVar4 = StringBuilder::_opString(sb,1,"xrelease ",0xffffffffffffffff), EVar4 == 0)))) &&
     (((uVar2 >> 0xd & 1) == 0 ||
      (EVar4 = StringBuilder::_opString(sb,1,"lock ",0xffffffffffffffff), EVar4 == 0)))) {
    if ((uVar2 & 0xc000) == 0) {
LAB_00165ccc:
      if ((int)uVar2 < 0) {
        EVar4 = unaff_R15D;
        if ((uVar2 & 0x1e000000) == 0) {
          EVar5 = StringBuilder::_opString(sb,1,"rex ",0xffffffffffffffff);
          bVar17 = EVar5 == 0;
          if (!bVar17) {
            EVar4 = EVar5;
          }
        }
        else {
          StringBuilder::_opString(sb,1,"rex.",0xffffffffffffffff);
          if ((uVar2 >> 0x1b & 1) != 0) {
            StringBuilder::_opChar(sb,1,'r');
          }
          if ((uVar2 >> 0x1a & 1) != 0) {
            StringBuilder::_opChar(sb,1,'x');
          }
          if ((uVar2 >> 0x19 & 1) != 0) {
            StringBuilder::_opChar(sb,1,'b');
          }
          if ((uVar2 >> 0x1c & 1) != 0) {
            StringBuilder::_opChar(sb,1,'w');
          }
          StringBuilder::_opChar(sb,1,' ');
          bVar17 = true;
        }
        unaff_R15D = EVar4;
        if (!bVar17) goto LAB_00165e1f;
      }
      if ((((uVar2 >> 10 & 1) != 0) &&
          (EVar4 = StringBuilder::_opString(sb,1,"vex3 ",0xffffffffffffffff), EVar4 != 0)) ||
         (((uVar2 >> 0xc & 1) != 0 &&
          (EVar4 = StringBuilder::_opString(sb,1,"evex ",0xffffffffffffffff), EVar4 != 0))))
      goto LAB_00165e1f;
      EVar5 = StringBuilder::_opString
                        (sb,1,&X86InstDB::nameData +
                              (*(uint *)(X86InstDB::instData + uVar16 * 0xc) >> 8 & 0x3fff),
                         0xffffffffffffffff);
      bVar17 = EVar5 == 0;
      EVar4 = unaff_R15D;
      if (!bVar17) {
        EVar4 = EVar5;
      }
    }
    else {
      pcVar11 = "rep ";
      if ((uVar2 >> 0xe & 1) == 0) {
        pcVar11 = "repnz ";
      }
      StringBuilder::_opString(sb,1,pcVar11,0xffffffffffffffff);
      if ((detail->extraReg)._signature == 0) goto LAB_00165ccc;
      EVar4 = StringBuilder::_opChar(sb,1,'{');
      if (EVar4 == 0) {
        aStack_40._packed[0] = (UInt64)detail->extraReg;
        aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        EVar4 = X86Logging::formatOperand
                          (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
        if ((EVar4 == 0) &&
           (EVar4 = StringBuilder::_opString(sb,1,"} ",0xffffffffffffffff), EVar4 == 0))
        goto LAB_00165ccc;
      }
      bVar17 = false;
    }
  }
  else {
LAB_00165e1f:
    bVar17 = false;
  }
  if (!bVar17) {
    return EVar4;
  }
LAB_00165e29:
  if (opCount == 0) {
    EVar4 = 0;
  }
  else {
    uVar16 = 0;
    do {
      if ((undefined1  [16])((undefined1  [16])opArray[uVar16].field_0 & (undefined1  [16])0x7) ==
          (undefined1  [16])0x0) {
        cVar3 = '\x1c';
        EVar5 = EVar4;
        goto LAB_00165ed7;
      }
      pcVar11 = ", ";
      if (uVar16 == 0) {
        pcVar11 = " ";
      }
      cVar3 = '\x01';
      EVar5 = StringBuilder::_opString(sb,1,pcVar11,0xffffffffffffffff);
      if (EVar5 != 0) goto LAB_00165ed7;
      op = opArray + uVar16;
      EVar5 = X86Logging::formatOperand(sb,logOptions,emitter,archType,op);
      if (EVar5 != 0) {
        bVar17 = false;
        EVar4 = EVar5;
        goto LAB_00165ed9;
      }
      if (((logOptions & 2) == 0) || (((op->field_0)._any.signature & 7) != 3)) goto LAB_00166343;
      lVar7 = 0;
      uVar9 = 0x10;
      do {
        uVar13 = *(uint *)((long)&opArray->field_0 + lVar7);
        uVar14 = uVar13 >> 0x18;
        uVar15 = (ulong)uVar14;
        if (uVar14 < (uint)uVar9) {
          uVar15 = uVar9;
        }
        if ((uVar13 & 7) != 1) {
          uVar15 = uVar9;
        }
        lVar7 = lVar7 + 0x10;
        uVar9 = uVar15;
      } while ((ulong)opCount << 4 != lVar7);
      EVar5 = 0;
      EVar6 = 0;
      uVar13 = (uint)*(byte *)((long)&op->field_0 + 8);
      uVar14 = (uint)uVar15;
      if ((int)uVar1 < 0x41e) {
        if ((int)uVar1 < 0x2b5) {
          if ((int)uVar1 < 0x1d6) {
            if ((int)uVar1 < 0x68) {
              if (uVar1 == 0x22) goto switchD_00165f80_caseD_455;
              EVar5 = EVar6;
              if (uVar1 == 0x23) {
LAB_0016620d:
                uVar8 = uVar14 >> 2;
                goto LAB_00166327;
              }
            }
            else {
              uVar8 = uVar1 - 0x68;
              if (uVar8 < 0x2f) {
                if ((0x1bUL >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
                  uVar10 = 3;
LAB_0016604c:
                  advance = 0;
                  puVar12 = "eq_oq";
                  count = 1;
                  goto LAB_00166138;
                }
                if ((0x600000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)
                goto switchD_00165f80_caseD_420;
              }
              if (uVar1 == 0x1ae) {
LAB_001662c2:
                uVar10 = uVar14 >> 3;
                if (3 < uVar14 >> 3) {
                  uVar10 = 4;
                }
                puVar12 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                          ::vmpsadbw;
                goto LAB_00166291;
              }
              EVar5 = EVar6;
              if (uVar1 == 0x1d5) goto switchD_00165f80_caseD_420;
            }
          }
          else {
            if ((int)uVar1 < 0x27a) {
              if (2 < uVar1 - 0x241) {
                if (uVar1 == 0x1d6) goto switchD_00165f80_caseD_427;
                EVar5 = EVar6;
                if (uVar1 != 0x240) goto switchD_00165f80_caseD_41f;
              }
              goto switchD_00165f80_caseD_456;
            }
            if (uVar1 - 0x27a < 4) goto switchD_00166004_caseD_547;
            EVar5 = EVar6;
            if (uVar1 == 0x2b4) goto switchD_00166004_caseD_569;
          }
        }
        else if ((int)uVar1 < 0x3a5) {
          if ((int)uVar1 < 0x319) {
            if ((int)uVar1 < 0x307) {
              if (uVar1 == 0x2b5) goto switchD_00166004_caseD_56a;
              if (uVar1 == 0x2f5) goto switchD_00165f80_caseD_455;
              EVar5 = EVar6;
              if (uVar1 == 0x2f6) goto LAB_0016620d;
            }
            else {
              EVar5 = EVar6;
              if (uVar1 - 0x307 < 4) {
                uVar10 = 5;
                goto LAB_0016604c;
              }
            }
          }
          else {
            if (uVar1 - 0x33e < 2) goto switchD_00165f80_caseD_420;
            if (uVar1 == 0x319) {
              puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vroundxx;
              goto LAB_001661c0;
            }
            EVar5 = EVar6;
            if (uVar1 == 0x339) goto switchD_00165f80_caseD_456;
          }
        }
        else {
          if (uVar1 - 0x3a5 < 4) {
            puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                       ::vfpclassxx;
LAB_001661c0:
            uVar10 = 1;
            goto LAB_00166291;
          }
          if (uVar1 - 0x3bd < 4) {
            puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                       ::vgetmantxx;
            goto LAB_001660c4;
          }
          EVar5 = EVar6;
          if (uVar1 == 0x3fc) goto LAB_001662c2;
        }
        goto switchD_00165f80_caseD_41f;
      }
      if (0x4f9 < (int)uVar1) {
        switch(uVar1) {
        case 0x53f:
        case 0x540:
        case 0x541:
        case 0x542:
        case 0x543:
        case 0x544:
        case 0x545:
        case 0x546:
          puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vreducexx_vrndscalexx;
LAB_001660c4:
          uVar10 = 3;
          goto LAB_00166291;
        case 0x547:
        case 0x548:
        case 0x549:
        case 0x54a:
switchD_00166004_caseD_547:
          puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vroundxx;
          goto LAB_0016628c;
        case 0x54b:
        case 0x54c:
        case 0x54d:
        case 0x54e:
        case 0x54f:
        case 0x550:
        case 0x551:
        case 0x552:
        case 0x553:
        case 0x554:
        case 0x555:
        case 0x556:
        case 0x557:
        case 0x558:
        case 0x559:
        case 0x55a:
        case 0x55b:
        case 0x55c:
        case 0x55d:
        case 0x55e:
        case 0x55f:
        case 0x560:
        case 0x561:
        case 0x562:
        case 0x563:
        case 0x564:
          break;
        case 0x565:
        case 0x566:
        case 0x567:
        case 0x568:
          uVar8 = (uint)(uVar15 >> 4);
          if (uVar8 < 3) {
            uVar8 = 2;
          }
          uVar10 = 2 - (uVar14 < 0x30);
          goto LAB_00166332;
        case 0x569:
switchD_00166004_caseD_569:
          count = uVar14 >> 3;
          if (7 < uVar14 >> 3) {
            count = 8;
          }
          uVar10 = 1;
          advance = 2;
          puVar12 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufpd;
          goto LAB_00166138;
        case 0x56a:
switchD_00166004_caseD_56a:
          puVar12 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufps;
          goto LAB_00166132;
        default:
          uVar9 = (ulong)(uVar1 - 0x4fa);
          EVar5 = EVar6;
          if (uVar1 - 0x4fa < 0x3b) {
            if ((0x780000000000000U >> (uVar9 & 0x3f) & 1) != 0) {
              puVar12 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vrangexx;
              goto LAB_0016628c;
            }
            if ((3UL >> (uVar9 & 0x3f) & 1) != 0) goto switchD_00165f80_caseD_456;
            if ((0x600000000U >> (uVar9 & 0x3f) & 1) != 0) goto switchD_00165f80_caseD_420;
          }
        }
        goto switchD_00165f80_caseD_41f;
      }
      switch(uVar1) {
      case 0x41e:
        uVar8 = uVar14 >> 2;
        if (7 < uVar8) {
          uVar8 = 8;
        }
        goto LAB_00166327;
      case 0x41f:
      case 0x421:
      case 0x422:
      case 0x423:
      case 0x424:
      case 0x425:
      case 0x426:
      case 0x428:
      case 0x42b:
      case 0x42c:
      case 0x42d:
      case 0x42e:
      case 0x42f:
      case 0x430:
      case 0x431:
      case 0x432:
      case 0x433:
      case 0x434:
      case 0x435:
      case 0x436:
      case 0x43f:
      case 0x440:
      case 0x447:
      case 0x448:
      case 1099:
      case 0x44c:
      case 0x44d:
      case 0x44e:
      case 0x44f:
      case 0x450:
      case 0x451:
      case 0x452:
      case 0x453:
      case 0x454:
      case 0x458:
        break;
      case 0x420:
switchD_00165f80_caseD_420:
        uVar10 = 1;
        uVar8 = 8;
        goto LAB_00166332;
      case 0x427:
switchD_00165f80_caseD_427:
        puVar12 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vpclmulqdq;
        goto LAB_0016628c;
      case 0x429:
      case 0x42a:
      case 0x437:
      case 0x438:
      case 0x439:
      case 0x43a:
      case 0x43b:
      case 0x43c:
        puVar12 = "eq";
        goto LAB_00166132;
      case 0x43d:
      case 0x43e:
      case 0x441:
      case 0x442:
      case 0x443:
      case 0x444:
      case 0x445:
      case 0x446:
        puVar12 = "lt";
LAB_00166132:
        uVar10 = 2;
        advance = 4;
        count = 4;
LAB_00166138:
        EVar5 = X86Logging_formatImmText(sb,uVar13,uVar10,advance,puVar12,count);
        break;
      case 0x449:
      case 0x44a:
        puVar12 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vperm2x128;
LAB_0016628c:
        uVar10 = 2;
LAB_00166291:
        EVar5 = X86Logging_formatImmBits(sb,uVar13,(ImmBits *)puVar12,uVar10);
        break;
      case 0x455:
switchD_00165f80_caseD_455:
        uVar8 = uVar14 >> 3;
LAB_00166327:
        uVar10 = 1;
        goto LAB_00166332;
      case 0x456:
      case 0x457:
      case 0x459:
switchD_00165f80_caseD_456:
        uVar10 = 2;
        uVar8 = 4;
LAB_00166332:
        EVar5 = X86Logging_formatImmShuf(sb,uVar13,uVar10,uVar8);
        break;
      default:
        if (uVar1 == 0x4f9) goto switchD_00165f80_caseD_456;
      }
switchD_00165f80_caseD_41f:
      if (EVar5 == 0) {
LAB_00166343:
        if (uVar16 == 0) {
          if (((detail->extraReg)._signature & 0xf00) == 0x300) {
            cVar3 = '\x01';
            EVar5 = StringBuilder::_opString(sb,1," {",0xffffffffffffffff);
            if (EVar5 == 0) {
              aStack_40._packed[0] = (UInt64)detail->extraReg;
              aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
              EVar5 = X86Logging::formatOperand
                                (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
              if (EVar5 == 0) {
                cVar3 = '\x01';
                EVar5 = StringBuilder::_opChar(sb,1,'}');
                if (EVar5 == 0) {
                  if ((uVar2 >> 0x17 & 1) != 0) {
                    pcVar11 = "{z}";
                    goto LAB_00166499;
                  }
                  goto LAB_0016634c;
                }
              }
            }
            goto LAB_00165ed7;
          }
          if ((uVar2 >> 0x17 & 1) != 0) {
            pcVar11 = " {z}";
LAB_00166499:
            cVar3 = '\x01';
            EVar5 = StringBuilder::_opString(sb,1,pcVar11,0xffffffffffffffff);
            if (EVar5 != 0) goto LAB_00165ed7;
          }
        }
LAB_0016634c:
        if (((op->field_0)._any.signature & 7) == 2 && (uVar2 >> 0x14 & 1) != 0) {
          EVar5 = StringBuilder::_opString(sb,1," {1tox}",0xffffffffffffffff);
          bVar17 = EVar5 == 0;
          cVar3 = !bVar17;
          if (!bVar17) {
            EVar4 = EVar5;
          }
        }
        else {
          cVar3 = '\0';
          bVar17 = true;
        }
      }
      else {
LAB_00165ed7:
        bVar17 = false;
        EVar4 = EVar5;
      }
LAB_00165ed9:
      if (!bVar17) goto LAB_001664d6;
      uVar16 = uVar16 + 1;
    } while (uVar16 != opCount);
    cVar3 = '\x1c';
LAB_001664d6:
    if (cVar3 == '\x1c') {
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

Error Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}